

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_crt.c
# Opt level: O1

int x509_get_uid(uchar **p,uchar *end,mbedtls_x509_buf *uid,int n)

{
  int iVar1;
  int iVar2;
  
  iVar2 = 0;
  if (*p != end) {
    uid->tag = (uint)**p;
    iVar1 = mbedtls_asn1_get_tag(p,end,&uid->len,n | 0xa0);
    iVar2 = 0;
    if ((iVar1 != -0x62) && (iVar2 = iVar1, iVar1 == 0)) {
      uid->p = *p;
      *p = *p + uid->len;
      iVar2 = 0;
    }
  }
  return iVar2;
}

Assistant:

static int x509_get_uid( unsigned char **p,
                         const unsigned char *end,
                         mbedtls_x509_buf *uid, int n )
{
    int ret;

    if( *p == end )
        return( 0 );

    uid->tag = **p;

    if( ( ret = mbedtls_asn1_get_tag( p, end, &uid->len,
            MBEDTLS_ASN1_CONTEXT_SPECIFIC | MBEDTLS_ASN1_CONSTRUCTED | n ) ) != 0 )
    {
        if( ret == MBEDTLS_ERR_ASN1_UNEXPECTED_TAG )
            return( 0 );

        return( ret );
    }

    uid->p = *p;
    *p += uid->len;

    return( 0 );
}